

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chr.cpp
# Opt level: O0

void combine_chr(double *p_value_g,int m,int num_chr,int *m_chr,double **NM)

{
  double *pdVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  ulong uVar7;
  void *pvVar8;
  int *piVar9;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  double dVar10;
  int i_1;
  int k_4;
  int k_3;
  double *CumSum;
  int k_2;
  double Sum1;
  int i;
  double temp;
  int j;
  int flag;
  int k_1;
  int q_1;
  int k;
  int q;
  double **M;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  int local_74;
  int local_70;
  int local_6c;
  int local_5c;
  double local_58;
  int local_4c;
  int local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  void *local_28;
  long local_20;
  long local_18;
  int local_10;
  int local_c;
  long local_8;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(in_EDX + 1);
  uVar7 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_28 = operator_new__(uVar7);
  for (local_2c = 0; local_2c <= local_10; local_2c = local_2c + 1) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)(local_c + 1);
    uVar7 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pvVar8 = operator_new__(uVar7);
    *(void **)((long)local_28 + (long)local_2c * 8) = pvVar8;
    for (local_30 = 0; local_30 <= local_c; local_30 = local_30 + 1) {
      *(undefined8 *)(*(long *)((long)local_28 + (long)local_2c * 8) + (long)local_30 * 8) =
           0xbff0000000000000;
    }
  }
  for (local_34 = 1; local_34 <= local_10; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 <= local_c; local_38 = local_38 + 1) {
      if (local_38 == 0) {
        **(undefined8 **)((long)local_28 + (long)local_34 * 8) = 0;
        bVar6 = false;
        for (local_40 = 1; local_40 <= local_34; local_40 = local_40 + 1) {
          pdVar1 = *(double **)((long)local_28 + (long)local_34 * 8);
          *pdVar1 = **(double **)(local_20 + (long)local_40 * 8) + *pdVar1;
          dVar10 = **(double **)(local_20 + (long)local_40 * 8);
          if ((dVar10 == -1.0) && (!NAN(dVar10))) {
            bVar6 = true;
          }
        }
        if (bVar6) {
          **(undefined8 **)((long)local_28 + (long)local_34 * 8) = 0xbff0000000000000;
        }
      }
      else if (local_34 == 1) {
        *(undefined8 *)(*(long *)((long)local_28 + 8) + (long)local_38 * 8) =
             *(undefined8 *)(*(long *)(local_20 + 8) + (long)local_38 * 8);
      }
      else {
        for (local_4c = 0; piVar9 = std::min<int>(&local_38,(int *)(local_18 + (long)local_34 * 4)),
            local_4c <= *piVar9; local_4c = local_4c + 1) {
          dVar10 = logsum(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
          *(double *)(*(long *)((long)local_28 + (long)local_34 * 8) + (long)local_38 * 8) = dVar10;
        }
      }
    }
  }
  local_58 = -1.0;
  for (local_5c = 0; local_5c <= local_c; local_5c = local_5c + 1) {
    local_58 = logsum(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(local_c + 1);
  uVar7 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar7);
  for (local_6c = 0; local_6c <= local_c; local_6c = local_6c + 1) {
    if (local_6c == 0) {
      *(undefined8 *)((long)pvVar8 + (long)local_c * 8) =
           *(undefined8 *)(*(long *)((long)local_28 + (long)local_10 * 8) + (long)local_c * 8);
    }
    else {
      dVar10 = logsum(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      *(double *)((long)pvVar8 + (long)(local_c - local_6c) * 8) = dVar10;
    }
  }
  for (local_70 = 0; local_70 <= local_c; local_70 = local_70 + 1) {
    dVar10 = exp(*(double *)((long)pvVar8 + (long)local_70 * 8) - local_58);
    *(double *)(local_8 + (long)local_70 * 8) = dVar10;
  }
  for (local_74 = 0; local_74 <= local_10; local_74 = local_74 + 1) {
    pvVar2 = *(void **)((long)local_28 + (long)local_74 * 8);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
  }
  if (local_28 != (void *)0x0) {
    operator_delete__(local_28);
  }
  if (pvVar8 != (void *)0x0) {
    operator_delete__(pvVar8);
  }
  return;
}

Assistant:

void combine_chr(double* p_value_g, int m, int num_chr, int* m_chr, double** NM)
{
    double** M;
    M = new double* [num_chr+1];
    for(int q=0; q<=num_chr; q++)
    {
        M[q] = new double [m+1];
        for(int k=0; k<=m; k++)
            M[q][k] = -1;
    }
    for(int q=1; q<=num_chr; q++)
    {
        for(int k=0; k<=m; k++)
        {
            if (k==0)
            {
                M[q][0] = 0;
                int flag = 0;
                for(int j=1; j<=q; j++){
                    M[q][0] += NM[j][0];
                    if (NM[j][0]==-1)
                        flag = 1;
                }
                if (flag==1)
                    M[q][0] = -1;
            }
            else if (q==1)
                M[1][k] = NM[1][k]; //could lower max_m_chr by taking care of this
            else
            {
                double temp = -1;
                for(int i=0; i<=min(k,m_chr[q]); i++)
                {
                    temp = M[q-1][k-i]+NM[q][i];
                    if (NM[q][i]==-1 || M[q-1][k-i]==-1)
                        temp = -1;
                    M[q][k] = logsum(M[q][k], temp);
                }
            }
        }
    }

    double Sum1 = -1;
    for(int k=0; k<=m; k++) {
        Sum1 = logsum(Sum1, M[num_chr][k]);
    }

    double* CumSum = new double [m+1];
    for(int k=0; k<=m; k++) {
        if (k==0) {
            CumSum[m] = M[num_chr][m];
        }
        else CumSum[m-k] = logsum(CumSum[m-k+1], M[num_chr][m-k]);
    }

    for(int k=0; k<=m; k++) {
        p_value_g[k] = exp(CumSum[k] - Sum1);
    }

    for(int i=0; i<=num_chr; i++)
    {
        delete [] M[i];
    }
    delete [] M;
    delete [] CumSum;
    return;
}